

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int cat_partial(char **argv)

{
  int iVar1;
  ulonglong idx_00;
  ulonglong start_00;
  ulonglong len_00;
  zip_uint64_t len;
  zip_uint64_t start;
  zip_uint64_t idx;
  char **argv_local;
  
  idx_00 = strtoull(*argv,(char **)0x0,10);
  start_00 = strtoull(argv[1],(char **)0x0,10);
  len_00 = strtoull(argv[2],(char **)0x0,10);
  iVar1 = cat_impl(idx_00,start_00,len_00);
  return iVar1;
}

Assistant:

static int
cat_partial(char *argv[]) {
    /* output partial file contents to stdout */
    zip_uint64_t idx;
    zip_uint64_t start;
    zip_uint64_t len;

    idx = strtoull(argv[0], NULL, 10);
    start = strtoull(argv[1], NULL, 10);
    len = strtoull(argv[2], NULL, 10);

    return cat_impl(idx, start, len);
}